

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgn_scanner.c
# Opt level: O3

int yylex_destroy(void)

{
  YY_BUFFER_STATE *__ptr;
  
  while (yy_buffer_stack != (YY_BUFFER_STATE *)0x0) {
    __ptr = yy_buffer_stack;
    if (yy_buffer_stack[yy_buffer_stack_top] == (YY_BUFFER_STATE)0x0) goto LAB_00104f3d;
    yy_delete_buffer(yy_buffer_stack[yy_buffer_stack_top]);
    yy_buffer_stack[yy_buffer_stack_top] = (YY_BUFFER_STATE)0x0;
    yypop_buffer_state();
  }
  __ptr = (YY_BUFFER_STATE *)0x0;
LAB_00104f3d:
  free(__ptr);
  yy_buffer_stack = (YY_BUFFER_STATE *)0x0;
  yy_buffer_stack_top = 0;
  yy_buffer_stack_max = 0;
  yy_c_buf_p = (char *)0x0;
  yy_init = 0;
  yy_start = 0;
  yyin = (FILE *)0x0;
  yyout = (FILE *)0x0;
  return 0;
}

Assistant:

int yylex_destroy  (void)
{
    
    /* Pop the buffer stack, destroying each element. */
	while(YY_CURRENT_BUFFER){
		yy_delete_buffer( YY_CURRENT_BUFFER  );
		YY_CURRENT_BUFFER_LVALUE = NULL;
		yypop_buffer_state();
	}

	/* Destroy the stack itself. */
	yyfree((yy_buffer_stack) );
	(yy_buffer_stack) = NULL;

    /* Reset the globals. This is important in a non-reentrant scanner so the next time
     * yylex() is called, initialization will occur. */
    yy_init_globals( );

    return 0;
}